

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

void __thiscall soplex::SPxSteepPR<double>::setRep(SPxSteepPR<double> *this,Representation param_1)

{
  SPxSolverBase<double> *pSVar1;
  VectorBase<double> tmp;
  _Vector_base<double,_std::allocator<double>_> _Stack_28;
  
  pSVar1 = (this->super_SPxPricer<double>).thesolver;
  if ((pSVar1->thecovectors->set).thenum !=
      (int)((ulong)((long)(this->workVec).super_VectorBase<double>.val.
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                   (long)(this->workVec).super_VectorBase<double>.val.
                         super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start) >> 3)) {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&_Stack_28,&(pSVar1->weights).val);
    pSVar1 = (this->super_SPxPricer<double>).thesolver;
    VectorBase<double>::operator=(&pSVar1->weights,&pSVar1->coWeights);
    VectorBase<double>::operator=
              (&((this->super_SPxPricer<double>).thesolver)->coWeights,
               (VectorBase<double> *)&_Stack_28);
    SSVectorBase<double>::clear(&this->workVec);
    SSVectorBase<double>::reDim
              (&this->workVec,
               (((this->super_SPxPricer<double>).thesolver)->thecovectors->set).thenum);
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&_Stack_28);
  }
  return;
}

Assistant:

void SPxSteepPR<R>::setRep(typename SPxSolverBase<R>::Representation)
{
   if(workVec.dim() != this->thesolver->dim())
   {
      VectorBase<R> tmp = this->thesolver->weights;
      this->thesolver->weights = this->thesolver->coWeights;
      this->thesolver->coWeights = tmp;

      workVec.clear();
      workVec.reDim(this->thesolver->dim());
   }
}